

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

OrphanBuilder *
capnp::_::OrphanBuilder::concat
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementSize elementSize,StructSize structSize,ArrayPtr<const_capnp::_::ListReader> lists)

{
  ListReader *pLVar1;
  ElementSize EVar2;
  ushort uVar3;
  ListElementCount LVar4;
  PointerReader other;
  StructReader other_00;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 extraout_RAX;
  byte bVar8;
  word *pwVar9;
  uint unaff_EBX;
  int iVar10;
  int iVar11;
  uint uVar12;
  anon_class_1_0_00000001 *this;
  uint i_2;
  uint uVar13;
  ulong uVar14;
  undefined2 uVar15;
  uint i;
  ElementCount index;
  ulong uVar16;
  ulong uVar17;
  ulong unaff_R14;
  word *pwVar18;
  ListReader *list;
  AllocateResult AVar19;
  AllocateResult AVar20;
  ListReader *__end3;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  ElementSize local_f4;
  uint local_e0;
  Exception *local_d8;
  Fault local_c0;
  undefined1 local_b8 [32];
  StructDataBitCount local_98;
  StructPointerCount local_94;
  uint local_8c;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  byte *local_78;
  int iStack_70;
  undefined4 uStack_6c;
  StructReader local_60;
  
  local_b8._0_8_ = lists.size_;
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
  local_b8._16_8_ = " > ";
  local_b8._24_8_ = (WirePointer *)0x4;
  local_98 = CONCAT31(local_98._1_3_,lists.size_ != 0);
  if (lists.size_ == 0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[25]>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd8d,FAILED,"lists.size() > 0","_kjCondition,\"Can\'t concat empty list \"",
               (DebugComparison<unsigned_long,_int> *)local_b8,
               (char (*) [25])"Can\'t concat empty list ");
    kj::_::Debug::Fault::fatal(&local_c0);
  }
  uVar14 = lists.size_ * 0x30;
  pLVar1 = lists.ptr + lists.size_;
  uVar16 = (ulong)(uint)structSize;
  uVar13 = (uint)structSize >> 0x10;
  uVar7 = 0;
  this = (anon_class_1_0_00000001 *)0x0;
  do {
    uVar15 = (undefined2)uVar16;
    uVar12 = (int)this + *(int *)((long)&(lists.ptr)->elementCount + uVar7);
    this = (anon_class_1_0_00000001 *)(ulong)uVar12;
    if (0x1fffffff < uVar12) {
      concat::anon_class_1_0_00000001::operator()(this);
      uVar12 = unaff_EBX;
      elementSize = local_f4;
      goto LAB_00234a7b;
    }
    EVar2 = (&(lists.ptr)->elementSize)[uVar7];
    if (EVar2 != elementSize) {
      local_c0.exception._0_1_ = elementSize != BIT && EVar2 != BIT;
      if (elementSize == BIT || EVar2 == BIT) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[40]>
                  ((Fault *)local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xd97,FAILED,
                   "list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT",
                   "_kjCondition,\"can\'t upgrade bit lists to struct lists\"",(bool *)&local_c0,
                   (char (*) [40])"can\'t upgrade bit lists to struct lists");
        kj::_::Debug::Fault::fatal((Fault *)local_b8);
      }
      elementSize = INLINE_COMPOSITE;
    }
    uVar17 = uVar16 & 0xffff;
    uVar16 = (ulong)*(uint *)((long)&(lists.ptr)->structDataSize + uVar7) + 0x3f >> 6;
    if (uVar16 <= uVar17) {
      uVar16 = uVar17;
    }
    uVar15 = (undefined2)uVar16;
    uVar3 = *(ushort *)((long)&(lists.ptr)->structPointerCount + uVar7);
    if ((ushort)uVar13 <= uVar3) {
      uVar13 = (uint)uVar3;
    }
    uVar7 = uVar7 + 0x30;
  } while (uVar14 != uVar7);
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (elementSize == INLINE_COMPOSITE) {
    uVar14 = uVar16 & 0xffff;
    iVar10 = (int)uVar14;
    local_e0 = uVar13 + iVar10;
    unaff_R14 = (ulong)local_e0 * (ulong)uVar12;
    if (0x1ffffffe < unaff_R14) {
LAB_00234a7b:
      iVar10 = (int)uVar14;
      WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)local_b8);
    }
    if (arena == (BuilderArena *)0x0) {
      WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
      kj::_::Debug::Fault::~Fault(&local_c0);
      _Unwind_Resume(extraout_RAX);
    }
    AVar19 = BuilderArena::allocate(arena,(int)unaff_R14 + 1);
    pwVar9 = AVar19.words;
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = (int)unaff_R14 * 8 + 7;
    *(uint *)&pwVar9->content = uVar12 << 2;
    *(undefined2 *)((long)&pwVar9->content + 4) = uVar15;
    *(short *)((long)&pwVar9->content + 6) = (short)uVar13;
    AVar20.words = pwVar9 + 1;
    AVar20.segment = AVar19.segment;
    iVar11 = 0;
    local_8c = uVar13;
    do {
      LVar4 = (lists.ptr)->elementCount;
      if (LVar4 != 0) {
        index = 0;
        do {
          local_b8._16_8_ =
               (long)&pwVar9[1].content + ((ulong)(iVar11 + index) * (ulong)(local_e0 << 6) >> 3);
          local_b8._24_8_ =
               (long)&(((WirePointer *)local_b8._16_8_)->offsetAndKind).value +
               (ulong)(uint)(iVar10 << 3);
          local_94 = (StructPointerCount)local_8c;
          local_b8._0_8_ = (Exception *)AVar19.segment;
          local_b8._8_8_ = capTable;
          local_98 = iVar10 << 6;
          ListReader::getStructElement(&local_60,lists.ptr,index);
          other_00.capTable = local_60.capTable;
          other_00.segment = local_60.segment;
          other_00.data = local_60.data;
          other_00.pointers = local_60.pointers;
          other_00.dataSize = local_60.dataSize;
          other_00.pointerCount = local_60.pointerCount;
          other_00._38_2_ = local_60._38_2_;
          other_00.nestingLimit = local_60.nestingLimit;
          other_00._44_4_ = local_60._44_4_;
          StructBuilder::copyContentFrom((StructBuilder *)local_b8,other_00);
          index = index + 1;
        } while (LVar4 != index);
        iVar11 = iVar11 + index;
      }
      lists.ptr = lists.ptr + 1;
    } while (lists.ptr != pLVar1);
  }
  else {
    uVar13 = *(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (ulong)elementSize * 4);
    AVar20 = BuilderArena::allocate
                       (arena,(SegmentWordCount)((ulong)uVar12 * (ulong)uVar13 + 0x3f >> 6));
    pwVar9 = AVar20.words;
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar12 * 8 | (uint)elementSize;
    if (elementSize == POINTER) {
      iVar10 = 0;
      do {
        local_d8 = (Exception *)AVar20.segment;
        uVar12 = (lists.ptr)->elementCount;
        if ((ulong)uVar12 != 0) {
          uVar14 = 0;
          do {
            local_b8._16_8_ =
                 (long)&pwVar9->content + ((ulong)(uint)((int)uVar14 + iVar10) * (ulong)uVar13 >> 3)
            ;
            local_b8._0_8_ = local_d8;
            local_78 = (lists.ptr)->ptr +
                       ((lists.ptr)->step * uVar14 >> 3) + (ulong)((lists.ptr)->structDataSize >> 3)
            ;
            iStack_70 = (lists.ptr)->nestingLimit;
            local_88 = (lists.ptr)->segment;
            pCStack_80 = (lists.ptr)->capTable;
            uVar5 = (lists.ptr)->segment;
            uVar6 = (lists.ptr)->capTable;
            other.capTable = (CapTableReader *)uVar6;
            other.segment = (SegmentReader *)uVar5;
            other._28_4_ = uStack_6c;
            other.nestingLimit = iStack_70;
            other.pointer = (WirePointer *)local_78;
            local_b8._8_8_ = capTable;
            PointerBuilder::copyFrom((PointerBuilder *)local_b8,other,false);
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
          iVar10 = iVar10 + (int)uVar14;
        }
        lists.ptr = lists.ptr + 1;
      } while (lists.ptr != pLVar1);
    }
    else if (elementSize == 1) {
      iVar10 = 0;
      do {
        LVar4 = (lists.ptr)->elementCount;
        if (LVar4 != 0) {
          uVar14 = 0;
          do {
            uVar13 = (uint)uVar14;
            uVar16 = (ulong)(iVar10 + uVar13 >> 3);
            bVar8 = (byte)(iVar10 + uVar13) & 7;
            *(byte *)((long)&pwVar9->content + uVar16) =
                 (((lists.ptr)->ptr[uVar14 >> 3] >> (uVar13 & 7) & 1) != 0) << bVar8 |
                 *(byte *)((long)&pwVar9->content + uVar16) & ~(byte)(1 << bVar8);
            uVar13 = uVar13 + 1;
            uVar14 = (ulong)uVar13;
          } while (LVar4 != uVar13);
          iVar10 = iVar10 + uVar13;
        }
        lists.ptr = lists.ptr + 1;
      } while (lists.ptr != pLVar1);
    }
    else {
      uVar16 = 0;
      do {
        uVar17 = (ulong)*(uint *)((long)&(lists.ptr)->elementCount + uVar16) * (ulong)(uVar13 >> 3);
        uVar7 = uVar17 & 0xffffffff;
        if (uVar7 != 0) {
          memcpy(pwVar9,*(void **)((long)&(lists.ptr)->ptr + uVar16),uVar7);
        }
        pwVar9 = (word *)((long)&pwVar9->content + uVar17);
        uVar16 = uVar16 + 0x30;
      } while (uVar14 != uVar16);
    }
  }
  pwVar18 = AVar20.words;
  local_d8 = (Exception *)AVar20.segment;
  pwVar9 = pwVar18 + -1;
  if (pwVar18 == (word *)0x0) {
    pwVar9 = pwVar18;
  }
  __return_storage_ptr__->segment = (SegmentBuilder *)local_d8;
  __return_storage_ptr__->capTable = capTable;
  if (elementSize != INLINE_COMPOSITE) {
    pwVar9 = pwVar18;
  }
  __return_storage_ptr__->location = pwVar9;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::concat(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementSize elementSize, StructSize structSize,
    kj::ArrayPtr<const ListReader> lists) {
  KJ_REQUIRE(lists.size() > 0, "Can't concat empty list ");

  // Find the overall element count and size.
  ListElementCount elementCount = ZERO * ELEMENTS;
  for (auto& list: lists) {
    elementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount + list.elementCount,
        []() { KJ_FAIL_REQUIRE("concatenated list exceeds list size limit"); });
    if (list.elementSize != elementSize) {
      // If element sizes don't all match, upgrade to struct list.
      KJ_REQUIRE(list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT,
                 "can't upgrade bit lists to struct lists");
      elementSize = ElementSize::INLINE_COMPOSITE;
    }
    structSize.data = kj::max(structSize.data,
        WireHelpers::roundBitsUpToWords(list.structDataSize));
    structSize.pointers = kj::max(structSize.pointers, list.structPointerCount);
  }

  // Allocate the list.
  OrphanBuilder result;
  ListBuilder builder = (elementSize == ElementSize::INLINE_COMPOSITE)
      ? WireHelpers::initStructListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, structSize, arena)
      : WireHelpers::initListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);

  // Copy elements.
  switch (elementSize) {
    case ElementSize::INLINE_COMPOSITE: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getStructElement(pos).copyContentFrom(list.getStructElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::POINTER: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getPointerElement(pos).copyFrom(list.getPointerElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::BIT: {
      // It's difficult to memcpy() bits since a list could start or end mid-byte. For now we
      // do a slow, naive loop. Probably no one will ever care.
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.setDataElement<bool>(pos, list.getDataElement<bool>(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    default: {
      // We know all the inputs are primitives with identical size because otherwise we would have
      // chosen INLINE_COMPOSITE. Therefore, we can safely use memcpy() here instead of copying
      // each element manually.
      byte* target = builder.ptr;
      auto step = builder.step / BITS_PER_BYTE;
      for (auto& list: lists) {
        auto count = step * upgradeBound<uint64_t>(list.size());
        WireHelpers::copyMemory(target, list.ptr, assumeBits<SEGMENT_WORD_COUNT_BITS>(count));
        target += count;
      }
      break;
    }
  }

  // Return orphan.
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}